

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * __thiscall cmTarget::GetPrefixVariableInternal(cmTarget *this,ArtifactType artifact)

{
  bool bVar1;
  TargetType TVar2;
  pointer pcVar3;
  ArtifactType artifact_local;
  cmTarget *this_local;
  
  TVar2 = GetType(this);
  switch(TVar2) {
  case EXECUTABLE:
    if (artifact == RuntimeBinaryArtifact) {
      bVar1 = IsAndroidGuiExecutable(this);
      if (!bVar1) {
        return "";
      }
      return "CMAKE_SHARED_LIBRARY_PREFIX";
    }
    if (artifact == ImportLibraryArtifact) {
      pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      if ((pcVar3->IsAIX & 1U) == 0) {
        return "CMAKE_IMPORT_LIBRARY_PREFIX";
      }
      return "CMAKE_AIX_IMPORT_FILE_PREFIX";
    }
    break;
  case STATIC_LIBRARY:
    this_local = (cmTarget *)anon_var_dwarf_924b91;
    return (char *)this_local;
  case SHARED_LIBRARY:
    if (artifact == RuntimeBinaryArtifact) {
      this_local = (cmTarget *)anon_var_dwarf_924b9e;
      return (char *)this_local;
    }
    if (artifact == ImportLibraryArtifact) {
      bVar1 = IsApple(this);
      if (!bVar1) {
        return "CMAKE_IMPORT_LIBRARY_PREFIX";
      }
      return "CMAKE_APPLE_IMPORT_FILE_PREFIX";
    }
    break;
  case MODULE_LIBRARY:
    if (artifact == RuntimeBinaryArtifact) {
      this_local = (cmTarget *)anon_var_dwarf_924bc5;
      return (char *)this_local;
    }
    if (artifact == ImportLibraryArtifact) {
      this_local = (cmTarget *)anon_var_dwarf_924bb8;
      return (char *)this_local;
    }
  }
  this_local = (cmTarget *)0x1193827;
  return (char *)this_local;
}

Assistant:

const char* cmTarget::GetPrefixVariableInternal(
  cmStateEnums::ArtifactType artifact) const
{
  switch (this->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      return "CMAKE_STATIC_LIBRARY_PREFIX";
    case cmStateEnums::SHARED_LIBRARY:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          return "CMAKE_SHARED_LIBRARY_PREFIX";
        case cmStateEnums::ImportLibraryArtifact:
          return this->IsApple() ? "CMAKE_APPLE_IMPORT_FILE_PREFIX"
                                 : "CMAKE_IMPORT_LIBRARY_PREFIX";
      }
      break;
    case cmStateEnums::MODULE_LIBRARY:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          return "CMAKE_SHARED_MODULE_PREFIX";
        case cmStateEnums::ImportLibraryArtifact:
          return "CMAKE_IMPORT_LIBRARY_PREFIX";
      }
      break;
    case cmStateEnums::EXECUTABLE:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          // Android GUI application packages store the native
          // binary as a shared library.
          return (this->IsAndroidGuiExecutable()
                    ? "CMAKE_SHARED_LIBRARY_PREFIX"
                    : "");
        case cmStateEnums::ImportLibraryArtifact:
          return (this->impl->IsAIX ? "CMAKE_AIX_IMPORT_FILE_PREFIX"
                                    : "CMAKE_IMPORT_LIBRARY_PREFIX");
      }
      break;
    default:
      break;
  }
  return "";
}